

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall QWidgetTextControlPrivate::isPreediting(QWidgetTextControlPrivate *this)

{
  long lVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::block();
  lVar1 = QTextBlock::layout();
  if (lVar1 == 0) {
    bVar2 = false;
  }
  else {
    QTextLayout::preeditAreaText();
    bVar2 = local_30.size != 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::isPreediting() const
{
    QTextLayout *layout = cursor.block().layout();
    if (layout && !layout->preeditAreaText().isEmpty())
        return true;

    return false;
}